

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicBoard.cpp
# Opt level: O1

void __thiscall
GraphicBoard::createTiles(GraphicBoard *this,QImage *image,size_t boardSize,size_t tileSize)

{
  vector<QImage,_std::allocator<QImage>_> *this_00;
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  size_t local_78;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  GraphicBoard *local_60;
  size_t local_58;
  QImage *local_50;
  QRect local_48;
  
  uVar5 = tileSize * boardSize;
  this_00 = &this->images;
  local_78 = tileSize;
  local_60 = this;
  local_58 = boardSize;
  local_50 = image;
  std::vector<QImage,_std::allocator<QImage>_>::reserve(this_00,boardSize * boardSize);
  if (uVar5 != 0) {
    uVar2 = 0;
    do {
      iVar1 = (int)uVar2;
      uVar4 = 0;
      do {
        if ((uVar5 - local_78 == uVar2) && (uVar5 - local_78 == uVar4)) break;
        iVar3 = (int)uVar4;
        local_68 = (int)local_78 + iVar3 + -1;
        local_64 = (int)local_78 + iVar1 + -1;
        local_70 = iVar3;
        local_6c = iVar1;
        QImage::copy(&local_48);
        std::vector<QImage,_std::allocator<QImage>_>::emplace_back<QImage>
                  (this_00,(QImage *)&local_48);
        QImage::~QImage((QImage *)&local_48);
        uVar4 = (ulong)(uint)(iVar3 + (int)local_78);
      } while (uVar4 <= uVar5 && uVar5 - uVar4 != 0);
      uVar2 = (ulong)(uint)(iVar1 + (int)local_78);
    } while (uVar2 <= uVar5 && uVar5 - uVar2 != 0);
  }
  local_48.x1 = 4;
  std::vector<QImage,std::allocator<QImage>>::
  emplace_back<unsigned_long&,unsigned_long&,QImage::Format>
            ((vector<QImage,std::allocator<QImage>> *)this_00,&local_78,&local_78,
             (Format *)&local_48);
  QImage::fill((int)(local_60->images).super__Vector_base<QImage,_std::allocator<QImage>_>._M_impl.
                    super__Vector_impl_data._M_finish - (darkCyan|green));
  Message::putMessage(GRAPHIC_LOAD_OK,local_58);
  return;
}

Assistant:

void GraphicBoard::createTiles( QImage& image, size_t boardSize, size_t tileSize )
{
    size_t pictureSize = boardSize * tileSize;
    images.reserve( boardSize * boardSize );

    for ( uint yPos = 0; yPos < pictureSize; yPos += tileSize )
    {
        for ( uint xPos = 0; xPos < pictureSize; xPos += tileSize )
        {
            if (( yPos == pictureSize - tileSize ) && ( xPos == pictureSize - tileSize ))
            {
                break;
            }
            images.emplace_back( image.copy( xPos, yPos, tileSize, tileSize ));
        }
    }

    images.emplace_back( tileSize, tileSize, QImage::Format_RGB32 );
    images.back().fill( Qt::GlobalColor::white );
    Message::putMessage( Result::GRAPHIC_LOAD_OK, boardSize );
}